

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.cpp
# Opt level: O0

string * __thiscall TrodesConfig::getPrintStr_abi_cxx11_(TrodesConfig *this,int indent)

{
  int iVar1;
  ostream *poVar2;
  size_type sVar3;
  int in_EDX;
  long in_RSI;
  string *in_RDI;
  int k_4;
  int i_1;
  int k_3;
  int k_2;
  int i;
  int k_1;
  int k;
  string indentStr;
  ostringstream oss;
  ostream *in_stack_fffffffffffffd38;
  reference in_stack_fffffffffffffd40;
  string local_228 [36];
  int local_204;
  int local_200;
  int local_1fc;
  string local_1f8 [36];
  int local_1d4;
  int local_1d0;
  int local_1cc;
  int local_1c8;
  allocator local_1b1;
  string local_1b0 [32];
  ostringstream local_190 [244];
  int in_stack_ffffffffffffff64;
  NTrodeObj *in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffffb4;
  NDevice *in_stack_ffffffffffffffb8;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b0,"\t",&local_1b1);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
  for (local_1c8 = 0; local_1c8 < in_EDX; local_1c8 = local_1c8 + 1) {
    std::operator<<((ostream *)local_190,local_1b0);
  }
  std::operator<<((ostream *)local_190,"Printing \'TrodesConfig\'\n");
  for (local_1cc = 0; local_1cc < in_EDX; local_1cc = local_1cc + 1) {
    std::operator<<((ostream *)local_190,local_1b0);
  }
  poVar2 = std::operator<<((ostream *)local_190,"    -devices vector size[");
  sVar3 = std::vector<NDevice,_std::allocator<NDevice>_>::size
                    ((vector<NDevice,_std::allocator<NDevice>_> *)(in_RSI + 8));
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar3);
  std::operator<<(poVar2,"]:\n");
  local_1d0 = 0;
  while( true ) {
    iVar1 = local_1d0;
    sVar3 = std::vector<NDevice,_std::allocator<NDevice>_>::size
                      ((vector<NDevice,_std::allocator<NDevice>_> *)(in_RSI + 8));
    if ((int)sVar3 <= iVar1) break;
    for (local_1d4 = 0; local_1d4 < in_EDX; local_1d4 = local_1d4 + 1) {
      std::operator<<((ostream *)local_190,local_1b0);
    }
    poVar2 = std::operator<<((ostream *)local_190,"        - i[");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_1d0);
    poVar2 = std::operator<<(poVar2,"] : \n");
    std::vector<NDevice,_std::allocator<NDevice>_>::at
              ((vector<NDevice,_std::allocator<NDevice>_> *)in_stack_fffffffffffffd40,
               (size_type)in_stack_fffffffffffffd38);
    NDevice::getPrintStr_abi_cxx11_(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4);
    poVar2 = std::operator<<(poVar2,local_1f8);
    std::operator<<(poVar2,"\n");
    std::__cxx11::string::~string(local_1f8);
    local_1d0 = local_1d0 + 1;
  }
  for (local_1fc = 0; local_1fc < in_EDX; local_1fc = local_1fc + 1) {
    std::operator<<((ostream *)local_190,local_1b0);
  }
  poVar2 = std::operator<<((ostream *)local_190,"    -nTrodes vector size[");
  sVar3 = std::vector<NTrodeObj,_std::allocator<NTrodeObj>_>::size
                    ((vector<NTrodeObj,_std::allocator<NTrodeObj>_> *)(in_RSI + 0x20));
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar3);
  std::operator<<(poVar2,"]:\n");
  local_200 = 0;
  while( true ) {
    iVar1 = local_200;
    sVar3 = std::vector<NTrodeObj,_std::allocator<NTrodeObj>_>::size
                      ((vector<NTrodeObj,_std::allocator<NTrodeObj>_> *)(in_RSI + 0x20));
    if ((int)sVar3 <= iVar1) break;
    for (local_204 = 0; local_204 < in_EDX; local_204 = local_204 + 1) {
      std::operator<<((ostream *)local_190,local_1b0);
    }
    poVar2 = std::operator<<((ostream *)local_190,"        - i[");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_200);
    poVar2 = std::operator<<(poVar2,"] : \n");
    in_stack_fffffffffffffd40 =
         std::vector<NTrodeObj,_std::allocator<NTrodeObj>_>::at
                   ((vector<NTrodeObj,_std::allocator<NTrodeObj>_> *)in_stack_fffffffffffffd40,
                    (size_type)in_stack_fffffffffffffd38);
    NTrodeObj::getPrintStr_abi_cxx11_(in_stack_ffffffffffffff68,in_stack_ffffffffffffff64);
    in_stack_fffffffffffffd38 = std::operator<<(poVar2,local_228);
    std::operator<<(in_stack_fffffffffffffd38,"\n");
    std::__cxx11::string::~string(local_228);
    local_200 = local_200 + 1;
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::~string(local_1b0);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return in_RDI;
}

Assistant:

std::string TrodesConfig::getPrintStr(int indent) {
    std::ostringstream oss;
    std::string indentStr = "\t";
    for (int k = 0; k < indent; k++) { oss << indentStr; }
    oss << "Printing 'TrodesConfig'\n";

    for (int k = 0; k < indent; k++) { oss << indentStr; }
    oss << "    -devices vector size[" << devices.size() << "]:\n";

    for (int i = 0; i < (int)devices.size(); i++) {
        for (int k = 0; k < indent; k++) { oss << indentStr; }
        oss << "        - i[" << i << "] : \n" << devices.at(i).getPrintStr(indent+2) << "\n";
    }

    for (int k = 0; k < indent; k++) { oss << indentStr; }
    oss << "    -nTrodes vector size[" << nTrodes.size() << "]:\n";

    for (int i = 0; i < (int)nTrodes.size(); i++) {
        for (int k = 0; k < indent; k++) { oss << indentStr; }
        oss << "        - i[" << i << "] : \n" << nTrodes.at(i).getPrintStr(indent+2) << "\n";
    }
    return(oss.str());
}